

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O1

Var write_commands(Context *ctx,Script *script)

{
  Command *pCVar1;
  Var obj;
  Var value;
  pointer puVar2;
  Var cmdObj;
  Var pvVar3;
  ulong uVar4;
  _func_int **src;
  PropertyId PVar5;
  char *messageIfFailed;
  _func_int **length;
  uint uVar6;
  AssertTrapCommandBase<(wabt::CommandType)10> *assert_trap_command;
  CommandType local_34;
  
  obj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
  value = (*ctx->chakra->spec->createArray)(ctx->chakra->user_data);
  set_property(ctx,obj,4,value,"Unable to set commands");
  puVar2 = (script->commands).
           super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((script->commands).
      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    local_34 = ~First;
    uVar6 = 1;
    uVar4 = 0;
    do {
      pCVar1 = puVar2[uVar4]._M_t.
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      cmdObj = (*ctx->chakra->spec->createObject)(ctx->chakra->user_data);
      (*ctx->chakra->spec->push)(value,cmdObj,ctx->chakra->user_data);
      write_command_type(ctx,pCVar1->type,cmdObj);
      switch(pCVar1->type) {
      case First:
        pvVar3 = (*ctx->chakra->spec->int32ToVar)
                           (*(int32 *)&pCVar1[2]._vptr_Command,ctx->chakra->user_data);
        set_property(ctx,cmdObj,7,pvVar3,"Unable to write number");
        if (*(size_t *)&pCVar1[3].type != 0) {
          write_string(ctx,cmdObj,8,(char *)pCVar1[3]._vptr_Command,*(size_t *)&pCVar1[3].type);
        }
        local_34 = uVar6 - Action;
        pvVar3 = create_module(ctx,(Module *)(pCVar1 + 1),true);
        PVar5 = 3;
        messageIfFailed = "Unable to set module";
        goto LAB_00f3bdc3;
      case Action:
      case AssertExhaustion:
        pvVar3 = (*ctx->chakra->spec->int32ToVar)
                           (*(int32 *)(pCVar1[1]._vptr_Command + 3),ctx->chakra->user_data);
        set_property(ctx,cmdObj,7,pvVar3,"Unable to write number");
        write_action(ctx,cmdObj,(ActionPtr *)(pCVar1 + 1));
        break;
      case Register:
        pvVar3 = (*ctx->chakra->spec->int32ToVar)
                           (*(int32 *)&pCVar1[4]._vptr_Command,ctx->chakra->user_data);
        set_property(ctx,cmdObj,7,pvVar3,"Unable to write number");
        if (*(int *)&pCVar1[5]._vptr_Command == 0) {
          if (pCVar1[5].type != local_34) {
            __assert_fail("register_command->var.index() == last_module_index",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/chakra/wabtapi.cc"
                          ,0x184,"Js::Var write_commands(Context *, Script *)");
          }
        }
        else {
          if (*(int *)&pCVar1[5]._vptr_Command != 1) {
            __assert_fail("is_index()",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                          ,0x36,"Index wabt::Var::index() const");
          }
          write_var(ctx,cmdObj,8,(Var *)(pCVar1 + 3));
        }
        src = pCVar1[1]._vptr_Command;
        length = *(_func_int ***)&pCVar1[1].type;
        PVar5 = 0;
        goto LAB_00f3bde3;
      case AssertMalformed:
      case AssertInvalid:
      case AssertUnlinkable:
      case AssertUninstantiable:
        write_invalid_module
                  (ctx,cmdObj,(ScriptModule *)pCVar1[1]._vptr_Command,(string *)&pCVar1[1].type);
        break;
      case AssertReturn:
        pvVar3 = (*ctx->chakra->spec->int32ToVar)
                           (*(int32 *)(pCVar1[1]._vptr_Command + 3),ctx->chakra->user_data);
        set_property(ctx,cmdObj,7,pvVar3,"Unable to write number");
        write_action(ctx,cmdObj,(ActionPtr *)(pCVar1 + 1));
        pvVar3 = create_const_vector(ctx,(ConstVector *)&pCVar1[1].type);
        PVar5 = 5;
        messageIfFailed = "Unable to write const vector";
LAB_00f3bdc3:
        set_property(ctx,cmdObj,PVar5,pvVar3,messageIfFailed);
        break;
      case AssertReturnCanonicalNan:
      case AssertReturnArithmeticNan:
        pvVar3 = (*ctx->chakra->spec->int32ToVar)
                           (*(int32 *)(pCVar1[1]._vptr_Command + 3),ctx->chakra->user_data);
        set_property(ctx,cmdObj,7,pvVar3,"Unable to write number");
        write_action(ctx,cmdObj,(ActionPtr *)(pCVar1 + 1));
        write_action_result_type(ctx,cmdObj,5,script,(ActionPtr *)(pCVar1 + 1));
        break;
      case AssertTrap:
        pvVar3 = (*ctx->chakra->spec->int32ToVar)
                           (*(int32 *)(pCVar1[1]._vptr_Command + 3),ctx->chakra->user_data);
        set_property(ctx,cmdObj,7,pvVar3,"Unable to write number");
        write_action(ctx,cmdObj,(ActionPtr *)(pCVar1 + 1));
        src = *(_func_int ***)&pCVar1[1].type;
        length = pCVar1[2]._vptr_Command;
        PVar5 = 10;
LAB_00f3bde3:
        write_string(ctx,cmdObj,PVar5,(char *)src,(size_t)length);
      }
      uVar4 = (ulong)uVar6;
      puVar2 = (script->commands).
               super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (uVar4 < (ulong)((long)(script->commands).
                                   super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  return obj;
}

Assistant:

Js::Var write_commands(Context* ctx, Script* script)
{

    Js::Var resultObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
    Js::Var commandsArr = ctx->chakra->spec->createArray(ctx->chakra->user_data);
    set_property(ctx, resultObj, PropertyIds::commands, commandsArr, "Unable to set commands");
    wabt::Index last_module_index = (wabt::Index) - 1;
    for (wabt::Index i = 0; i < script->commands.size(); ++i)
    {
        const Command* command = script->commands[i].get();

        Js::Var cmdObj = ctx->chakra->spec->createObject(ctx->chakra->user_data);
        ctx->chakra->spec->push(commandsArr, cmdObj, ctx->chakra->user_data);
        write_command_type(ctx, command->type, cmdObj);

        switch (command->type)
        {
        case CommandType::Module:
        {
            const Module& module = cast<ModuleCommand>(command)->module;
            write_location(ctx, cmdObj, &module.loc);
            if (!module.name.empty())
            {
                write_string(ctx, cmdObj, PropertyIds::name, module.name);
            }
            write_module(ctx, cmdObj, &module);
            last_module_index = i;
            break;
        }

        case CommandType::Action:
        {
            const ActionPtr& action = cast<ActionCommand>(command)->action;
            write_location(ctx, cmdObj, &action->loc);
            write_action(ctx, cmdObj, action);
            break;
        }
        case CommandType::Register:
        {
            auto* register_command = cast<RegisterCommand>(command);
            write_location(ctx, cmdObj, &register_command->var.loc);
            if (register_command->var.is_name())
            {
                write_var(ctx, cmdObj, PropertyIds::name, &register_command->var);
            }
            else
            {
                /* If we're not registering by name, then we should only be
                * registering the last module. */
                WABT_USE(last_module_index);
                assert(register_command->var.index() == last_module_index);
            }
            write_string(ctx, cmdObj, PropertyIds::as, register_command->module_name);
            break;
        }
        case CommandType::AssertMalformed:
        {
            auto* assert_malformed_command = cast<AssertMalformedCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_malformed_command->module.get(),
                assert_malformed_command->text);
            break;
        }
        case CommandType::AssertInvalid:
        {
            auto* assert_invalid_command = cast<AssertInvalidCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_invalid_command->module.get(),
                assert_invalid_command->text);
            break;
        }
        case CommandType::AssertUnlinkable:
        {
            auto* assert_unlinkable_command = cast<AssertUnlinkableCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_unlinkable_command->module.get(),
                assert_unlinkable_command->text);
            break;
        }
        case CommandType::AssertUninstantiable:
        {
            auto* assert_uninstantiable_command = cast<AssertUninstantiableCommand>(command);
            write_invalid_module(ctx, cmdObj, assert_uninstantiable_command->module.get(),
                assert_uninstantiable_command->text);
            break;
        }
        case CommandType::AssertReturn:
        {
            auto* assert_return_command = cast<AssertReturnCommand>(command);
            write_location(ctx, cmdObj, &assert_return_command->action->loc);
            write_action(ctx, cmdObj, assert_return_command->action);
            write_const_vector(ctx, cmdObj, PropertyIds::expected, assert_return_command->expected);
            break;
        }
        case CommandType::AssertReturnCanonicalNan:
        {
            auto* assert_return_canonical_nan_command = cast<AssertReturnCanonicalNanCommand>(command);
            write_location(ctx, cmdObj, &assert_return_canonical_nan_command->action->loc);
            write_action(ctx, cmdObj, assert_return_canonical_nan_command->action);
            write_action_result_type(ctx, cmdObj, PropertyIds::expected, script,
                assert_return_canonical_nan_command->action);
            break;
        }
        case CommandType::AssertReturnArithmeticNan:
        {
            auto* assert_return_arithmetic_nan_command = cast<AssertReturnArithmeticNanCommand>(command);
            write_location(ctx, cmdObj, &assert_return_arithmetic_nan_command->action->loc);
            write_action(ctx, cmdObj, assert_return_arithmetic_nan_command->action);
            write_action_result_type(ctx, cmdObj, PropertyIds::expected, script,
                assert_return_arithmetic_nan_command->action);
            break;
        }
        case CommandType::AssertTrap:
        {
            auto* assert_trap_command = cast<AssertTrapCommand>(command);
            write_location(ctx, cmdObj, &assert_trap_command->action->loc);
            write_action(ctx, cmdObj, assert_trap_command->action);
            write_string(ctx, cmdObj, PropertyIds::text, assert_trap_command->text);
            break;
        }
        case CommandType::AssertExhaustion:
        {
            auto* assert_exhaustion_command = cast<AssertExhaustionCommand>(command);
            write_location(ctx, cmdObj, &assert_exhaustion_command->action->loc);
            write_action(ctx, cmdObj, assert_exhaustion_command->action);
            break;
        }
        }
    }
    return resultObj;
}